

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  int iVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined7 extraout_var;
  uint uVar3;
  char *parameterName;
  uint local_54;
  SimpleString local_50;
  uint local_44;
  TestPlugin *local_40;
  SimpleString argument;
  
  local_44 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  uVar3 = 1;
  local_40 = plugin;
  while( true ) {
    iVar1 = this->ac_;
    if (iVar1 <= (int)uVar3) break;
    local_54 = uVar3;
    SimpleString::SimpleString(&argument,this->av_[(int)uVar3]);
    SimpleString::SimpleString(&local_50,"-v");
    bVar2 = operator==(&argument,&local_50);
    SimpleString::~SimpleString(&local_50);
    if (bVar2) {
      this->verbose_ = true;
    }
    else {
      SimpleString::SimpleString(&local_50,"-c");
      bVar2 = operator==(&argument,&local_50);
      SimpleString::~SimpleString(&local_50);
      if (bVar2) {
        this->color_ = true;
      }
      else {
        SimpleString::SimpleString(&local_50,"-p");
        bVar2 = operator==(&argument,&local_50);
        SimpleString::~SimpleString(&local_50);
        if (bVar2) {
          this->runTestsAsSeperateProcess_ = true;
        }
        else {
          SimpleString::SimpleString(&local_50,"-lg");
          bVar2 = operator==(&argument,&local_50);
          SimpleString::~SimpleString(&local_50);
          if (bVar2) {
            this->listTestGroupNames_ = true;
          }
          else {
            SimpleString::SimpleString(&local_50,"-ln");
            bVar2 = operator==(&argument,&local_50);
            SimpleString::~SimpleString(&local_50);
            if (bVar2) {
              this->listTestGroupAndCaseNames_ = true;
            }
            else {
              SimpleString::SimpleString(&local_50,"-ri");
              bVar2 = operator==(&argument,&local_50);
              SimpleString::~SimpleString(&local_50);
              if (bVar2) {
                this->runIgnored_ = true;
              }
              else {
                SimpleString::SimpleString(&local_50,"-r");
                bVar2 = SimpleString::startsWith(&argument,&local_50);
                SimpleString::~SimpleString(&local_50);
                if (bVar2) {
                  SetRepeatCount(this,this->ac_,this->av_,(int *)&local_54);
                }
                else {
                  SimpleString::SimpleString(&local_50,"-g");
                  bVar2 = SimpleString::startsWith(&argument,&local_50);
                  SimpleString::~SimpleString(&local_50);
                  if (bVar2) {
                    AddGroupFilter(this,this->ac_,this->av_,(int *)&local_54);
                  }
                  else {
                    SimpleString::SimpleString(&local_50,"-sg");
                    bVar2 = SimpleString::startsWith(&argument,&local_50);
                    SimpleString::~SimpleString(&local_50);
                    if (bVar2) {
                      AddStrictGroupFilter(this,this->ac_,this->av_,(int *)&local_54);
                    }
                    else {
                      SimpleString::SimpleString(&local_50,"-xg");
                      bVar2 = SimpleString::startsWith(&argument,&local_50);
                      SimpleString::~SimpleString(&local_50);
                      if (bVar2) {
                        AddExcludeGroupFilter(this,this->ac_,this->av_,(int *)&local_54);
                      }
                      else {
                        SimpleString::SimpleString(&local_50,"-xsg");
                        bVar2 = SimpleString::startsWith(&argument,&local_50);
                        SimpleString::~SimpleString(&local_50);
                        if (bVar2) {
                          AddExcludeStrictGroupFilter(this,this->ac_,this->av_,(int *)&local_54);
                        }
                        else {
                          SimpleString::SimpleString(&local_50,"-n");
                          bVar2 = SimpleString::startsWith(&argument,&local_50);
                          SimpleString::~SimpleString(&local_50);
                          if (bVar2) {
                            AddNameFilter(this,this->ac_,this->av_,(int *)&local_54);
                          }
                          else {
                            SimpleString::SimpleString(&local_50,"-sn");
                            bVar2 = SimpleString::startsWith(&argument,&local_50);
                            SimpleString::~SimpleString(&local_50);
                            if (bVar2) {
                              AddStrictNameFilter(this,this->ac_,this->av_,(int *)&local_54);
                            }
                            else {
                              SimpleString::SimpleString(&local_50,"-xn");
                              bVar2 = SimpleString::startsWith(&argument,&local_50);
                              SimpleString::~SimpleString(&local_50);
                              if (bVar2) {
                                AddExcludeNameFilter(this,this->ac_,this->av_,(int *)&local_54);
                              }
                              else {
                                SimpleString::SimpleString(&local_50,"-xsn");
                                bVar2 = SimpleString::startsWith(&argument,&local_50);
                                SimpleString::~SimpleString(&local_50);
                                if (bVar2) {
                                  AddExcludeStrictNameFilter
                                            (this,this->ac_,this->av_,(int *)&local_54);
                                }
                                else {
                                  SimpleString::SimpleString(&local_50,"TEST(");
                                  bVar2 = SimpleString::startsWith(&argument,&local_50);
                                  SimpleString::~SimpleString(&local_50);
                                  parameterName = "TEST(";
                                  if (!bVar2) {
                                    SimpleString::SimpleString(&local_50,"IGNORE_TEST(");
                                    bVar2 = SimpleString::startsWith(&argument,&local_50);
                                    SimpleString::~SimpleString(&local_50);
                                    parameterName = "IGNORE_TEST(";
                                    if (!bVar2) {
                                      SimpleString::SimpleString(&local_50,"-o");
                                      bVar2 = SimpleString::startsWith(&argument,&local_50);
                                      SimpleString::~SimpleString(&local_50);
                                      if (bVar2) {
                                        bVar2 = SetOutputType(this,this->ac_,this->av_,
                                                              (int *)&local_54);
                                        local_44 = (uint)CONCAT71(extraout_var,bVar2);
                                      }
                                      else {
                                        SimpleString::SimpleString(&local_50,"-p");
                                        bVar2 = SimpleString::startsWith(&argument,&local_50);
                                        SimpleString::~SimpleString(&local_50);
                                        if (bVar2) {
                                          local_44 = (*local_40->_vptr_TestPlugin[7])
                                                               (local_40,(ulong)(uint)this->ac_,
                                                                this->av_,(ulong)uVar3);
                                        }
                                        else {
                                          SimpleString::SimpleString(&local_50,"-k");
                                          bVar2 = SimpleString::startsWith(&argument,&local_50);
                                          SimpleString::~SimpleString(&local_50);
                                          if (bVar2) {
                                            SetPackageName(this,this->ac_,this->av_,(int *)&local_54
                                                          );
                                          }
                                          else {
                                            local_44 = 0;
                                          }
                                        }
                                      }
                                      goto LAB_001a6141;
                                    }
                                  }
                                  AddTestToRunBasedOnVerboseOutput
                                            (this,this->ac_,this->av_,(int *)&local_54,parameterName
                                            );
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_001a6141:
    SimpleString::~SimpleString(&argument);
    if ((local_44 & 1) == 0) break;
    uVar3 = local_54 + 1;
  }
  return iVar1 <= (int)uVar3;
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if      (argument == "-v") verbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument.startsWith("-r")) SetRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) AddGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) AddStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) AddExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) AddExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) AddNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) AddStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) AddExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) AddExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("TEST(")) AddTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) AddTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = SetOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) SetPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}